

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

void __thiscall
tchecker::zg::details::local_m_extrapolation_t::local_m_extrapolation_t
          (local_m_extrapolation_t *this,local_m_extrapolation_t *e)

{
  local_m_extrapolation_t *e_local;
  local_m_extrapolation_t *this_local;
  
  extrapolation_t::extrapolation_t(&this->super_extrapolation_t);
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__local_m_extrapolation_t_003b4168;
  this->_m = e->_m;
  std::shared_ptr<const_tchecker::clockbounds::local_m_map_t>::shared_ptr
            (&this->_clock_bounds,&e->_clock_bounds);
  e->_m = (map_t *)0x0;
  return;
}

Assistant:

local_m_extrapolation_t::local_m_extrapolation_t(tchecker::zg::details::local_m_extrapolation_t && e)
    : _m(std::move(e._m)), _clock_bounds(std::move(e._clock_bounds))
{
  e._m = nullptr;
}